

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugrid2mesh.c
# Opt level: O1

double swapd(double d)

{
  return (double)((ulong)d >> 0x38 | ((ulong)d & 0xff000000000000) >> 0x28 |
                  ((ulong)d & 0xff0000000000) >> 0x18 | ((ulong)d & 0xff00000000) >> 8 |
                  ((ulong)d & 0xff000000) << 8 | ((ulong)d & 0xff0000) << 0x18 |
                  ((ulong)d & 0xff00) << 0x28 | (long)d << 0x38);
}

Assistant:

double swapd(double d)
{
   double a;
   unsigned char *dst = (unsigned char *)&a;
   unsigned char *src = (unsigned char *)&d;

   if ( ! littleEndian() ) return d;

   dst[0] = src[7];
   dst[1] = src[6];
   dst[2] = src[5];
   dst[3] = src[4];
   dst[4] = src[3];
   dst[5] = src[2];
   dst[6] = src[1];
   dst[7] = src[0];

   return a;
}